

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O1

sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> * __thiscall
klogic::transform::
continuous<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<double,std::allocator<double>>>
          (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
           *__return_storage_ptr__,transform *this,vector<double,_std::allocator<double>_> *values,
          vector<double,_std::allocator<double>_> *desired)

{
  pointer pcVar1;
  double *pdVar2;
  double dVar3;
  cvector result_1;
  cvector result;
  allocator_type local_99;
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58,(vector<double,_std::allocator<double>_> *)this);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_40,
             (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_70);
  dVar3 = local_98;
  pcVar1 = local_40.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pdVar2 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    local_98 = *pdVar2;
    if ((local_98 < 0.0) || (6.283185307179586 <= local_98)) goto LAB_00104bd1;
    local_90 = cos(local_98);
    dVar3 = sin(local_98);
    *(double *)pcVar1->_M_value = local_90;
    *(double *)((long)pcVar1->_M_value + 8) = dVar3;
    pcVar1 = pcVar1 + 1;
    dVar3 = local_98;
  }
  local_98 = dVar3;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,values);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_70,
             (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_99);
  dVar3 = local_98;
  pdVar2 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = local_70.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pdVar2 == local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      local_98 = dVar3;
      learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
      sample(__return_storage_ptr__,&local_40,&local_70);
      if (local_70.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_40.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_98 = *pdVar2;
    if ((local_98 < 0.0) || (6.283185307179586 <= local_98)) break;
    local_90 = cos(local_98);
    dVar3 = sin(local_98);
    *(double *)pcVar1->_M_value = local_90;
    *(double *)((long)pcVar1->_M_value + 8) = dVar3;
    pdVar2 = pdVar2 + 1;
    pcVar1 = pcVar1 + 1;
    dVar3 = local_98;
  }
LAB_00104bd1:
  local_98 = dVar3;
  __assert_fail("x >= 0 && x < TWOPI",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/transforms.h"
                ,0x2c,"cmplx klogic::transform::continuous(double)");
}

Assistant:

learning::sample<Desired> continuous(const std::vector<double> &values, const Input &desired) {
            return learning::sample<Desired>(continuous(values), continuous(desired));
        }